

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O1

IVec2 __thiscall
deqp::gles31::Functional::anon_unknown_0::RandomizedRenderGrid::getOrigin
          (RandomizedRenderGrid *this)

{
  int iVar1;
  int i;
  int iVar2;
  long lVar3;
  int in_RDI [2];
  IVec2 *currentOrigin;
  Vector<int,_2> res;
  int local_8 [2];
  
  iVar2 = this->m_currentCell + -1;
  iVar1 = (this->m_grid).m_data[0];
  local_8[0] = iVar2 % iVar1;
  local_8[1] = iVar2 / iVar1;
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  lVar3 = 0;
  do {
    res.m_data[lVar3] = (this->m_cellSize).m_data[lVar3] * local_8[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  *(undefined8 *)in_RDI = 0;
  lVar3 = 0;
  do {
    *(int *)((long)in_RDI + lVar3 * 4) =
         (this->m_baseRandomOffset).m_data[lVar3] + res.m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  return (IVec2)in_RDI;
}

Assistant:

IVec2 RandomizedRenderGrid::getOrigin (void) const
{
	const int	gridX		  = (m_currentCell - 1) % m_grid.x();
	const int	gridY		  = (m_currentCell - 1) / m_grid.x();
	const IVec2 currentOrigin = (IVec2(gridX, gridY) * m_cellSize) + m_baseRandomOffset;

	DE_ASSERT(currentOrigin.x() >= 0 && (currentOrigin.x() + m_cellSize.x()) <= m_targetSize.x());
	DE_ASSERT(currentOrigin.y() >= 0 && (currentOrigin.y() + m_cellSize.y()) <= m_targetSize.y());

	return currentOrigin;
}